

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTryTable
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *labels,
          vector<bool,_std::allocator<bool>_> *isRefs)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  TryTable *trytable_00;
  size_type size;
  reference puVar2;
  Name *pNVar3;
  Err local_e8;
  Err *local_c8;
  Err *err;
  undefined1 local_b0 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> name;
  const_iterator cStack_58;
  uint label_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  TryTable *trytable;
  IRBuilder *this_local;
  Signature sig_local;
  Name label_local;
  
  trytable_00 = MixedArena::alloc<wasm::TryTable>(&this->wasm->allocator);
  (trytable_00->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id =
       sig.results.id.id;
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&trytable_00->catchTags,tags);
  ArenaVectorBase<ArenaVector<bool>,bool>::set<std::vector<bool,std::allocator<bool>>>
            ((ArenaVectorBase<ArenaVector<bool>,bool> *)&trytable_00->catchRefs,isRefs);
  size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(labels);
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::reserve
            (&(trytable_00->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
             size);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(labels);
  cStack_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(labels);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa8);
    if (!bVar1) {
      visitTryTableStart(__return_storage_ptr__,this,trytable_00,label,sig.params.id);
      return __return_storage_ptr__;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
    getLabelName((Result<wasm::Name> *)__return_storage_ptr___00,this,*puVar2,false);
    Result<wasm::Name>::Result
              ((Result<wasm::Name> *)local_b0,(Result<wasm::Name> *)__return_storage_ptr___00);
    local_c8 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_b0);
    bVar1 = local_c8 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_e8,local_c8);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e8);
      wasm::Err::~Err(&local_e8);
    }
    Result<wasm::Name>::~Result((Result<wasm::Name> *)local_b0);
    if (!bVar1) {
      pNVar3 = Result<wasm::Name>::operator*
                         ((Result<wasm::Name> *)
                          ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
                (&(trytable_00->catchDests).
                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                 (Name)(pNVar3->super_IString).str);
    }
    Result<wasm::Name>::~Result
              ((Result<wasm::Name> *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    if (bVar1 && bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTryTable(Name label,
                                 Signature sig,
                                 const std::vector<Name>& tags,
                                 const std::vector<Index>& labels,
                                 const std::vector<bool>& isRefs) {
  auto* trytable = wasm.allocator.alloc<TryTable>();
  trytable->type = sig.results;
  trytable->catchTags.set(tags);
  trytable->catchRefs.set(isRefs);
  trytable->catchDests.reserve(labels.size());
  for (auto label : labels) {
    auto name = getLabelName(label);
    CHECK_ERR(name);
    trytable->catchDests.push_back(*name);
  }
  return visitTryTableStart(trytable, label, sig.params);
}